

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O2

Expression * __thiscall
soul::HEARTGenerator::evaluateAsExpression(HEARTGenerator *this,Expression *e)

{
  FunctionBuilder *this_00;
  Allocator *pAVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  Constant *pCVar5;
  Constant *pCVar6;
  Variable *pVVar7;
  VariableRef *pVVar8;
  StructMemberRef *pSVar9;
  Expression *pEVar10;
  Expression *pEVar11;
  ArrayElementRef *pAVar12;
  TypeCast *pTVar13;
  size_t sVar14;
  CommaSeparatedList *pCVar15;
  pool_ref<soul::AST::Expression> *ppVar16;
  undefined4 extraout_var;
  ArraySize AVar17;
  BinaryOperator *pBVar18;
  Expression *pEVar19;
  UnaryOperator *pUVar20;
  ProcessorProperty *pPVar21;
  ProcessorProperty *pPVar22;
  CodeLocation *this_01;
  pool_ptr<soul::AST::Constant> c;
  pool_ptr<soul::AST::VariableRef> v;
  pool_ptr<soul::AST::BinaryOperator> op;
  Type local_f8;
  Type local_e0;
  pool_ptr<soul::AST::BinaryOperator> local_c8;
  CodeLocation local_c0;
  CodeLocation local_b0;
  Scope local_a0;
  pool_ref<soul::AST::Expression> local_98;
  CompileMessage local_90;
  CompileMessage local_58;
  
  uVar3 = this->expressionDepth + 1;
  this->expressionDepth = uVar3;
  if (uVar3 < this->maxExpressionDepth) {
    (*(e->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_f8,e);
    if ((Constant *)local_f8._0_8_ != (Constant *)0x0) {
      pAVar1 = this->module->allocator;
      pCVar5 = pool_ptr<soul::AST::Constant>::operator->((pool_ptr<soul::AST::Constant> *)&local_f8)
      ;
      pCVar6 = pool_ptr<soul::AST::Constant>::operator->((pool_ptr<soul::AST::Constant> *)&local_f8)
      ;
      pVVar7 = (Variable *)
               PoolAllocator::allocate<soul::heart::Constant,soul::CodeLocation&,soul::Value&>
                         (&pAVar1->pool,
                          &(pCVar5->super_Expression).super_Statement.super_ASTObject.context.
                           location,&pCVar6->value);
      return &pVVar7->super_Expression;
    }
    cast<soul::AST::VariableRef,soul::AST::Expression>((soul *)&local_e0,e);
    if (local_e0._0_8_ == 0) {
      cast<soul::AST::StructMemberRef,soul::AST::Expression>((soul *)&local_e0,e);
      if (local_e0._0_8_ == 0) {
        cast<soul::AST::ArrayElementRef,soul::AST::Expression>((soul *)&local_e0,e);
        if (local_e0._0_8_ == 0) {
          cast<soul::AST::TypeCast,soul::AST::Expression>((soul *)&local_f8,e);
          if ((Constant *)local_f8._0_8_ != (Constant *)0x0) {
            pTVar13 = pool_ptr<soul::AST::TypeCast>::operator->
                                ((pool_ptr<soul::AST::TypeCast> *)&local_f8);
            sVar14 = AST::TypeCast::getNumArguments(pTVar13);
            if (sVar14 == 0) {
              throwInternalCompilerError("c->getNumArguments() != 0","evaluateAsExpression",0x26b);
            }
            pTVar13 = pool_ptr<soul::AST::TypeCast>::operator->
                                ((pool_ptr<soul::AST::TypeCast> *)&local_f8);
            pEVar11 = (pTVar13->source).object;
            pTVar13 = pool_ptr<soul::AST::TypeCast>::operator->
                                ((pool_ptr<soul::AST::TypeCast> *)&local_f8);
            local_98.object = (pTVar13->source).object;
            cast<soul::AST::CommaSeparatedList,soul::AST::Expression>((soul *)&local_e0,&local_98);
            if (local_e0._0_8_ != 0) {
              pCVar15 = pool_ptr<soul::AST::CommaSeparatedList>::operator->
                                  ((pool_ptr<soul::AST::CommaSeparatedList> *)&local_e0);
              if ((pCVar15->items).numActive != 1) {
                pTVar13 = pool_ptr<soul::AST::TypeCast>::operator*
                                    ((pool_ptr<soul::AST::TypeCast> *)&local_f8);
                pVVar7 = createAggregateWithInitialisers(this,pTVar13);
                return &pVVar7->super_Expression;
              }
              pCVar15 = pool_ptr<soul::AST::CommaSeparatedList>::operator->
                                  ((pool_ptr<soul::AST::CommaSeparatedList> *)&local_e0);
              ppVar16 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::front
                                  (&pCVar15->items);
              pEVar11 = ppVar16->object;
            }
            pEVar10 = evaluateAsExpression(this,pEVar11);
            iVar4 = (*(pEVar10->super_Object)._vptr_Object[2])(pEVar10);
            pTVar13 = pool_ptr<soul::AST::TypeCast>::operator->
                                ((pool_ptr<soul::AST::TypeCast> *)&local_f8);
            bVar2 = TypeRules::canCastTo(&pTVar13->targetType,(Type *)CONCAT44(extraout_var,iVar4));
            if (bVar2) {
              pTVar13 = pool_ptr<soul::AST::TypeCast>::operator->
                                  ((pool_ptr<soul::AST::TypeCast> *)&local_f8);
              pVVar7 = (Variable *)
                       BlockBuilder::createCastIfNeeded
                                 (&(this->builder).super_BlockBuilder,pEVar10,&pTVar13->targetType);
              return &pVVar7->super_Expression;
            }
            pTVar13 = pool_ptr<soul::AST::TypeCast>::operator->
                                ((pool_ptr<soul::AST::TypeCast> *)&local_f8);
            bVar2 = Type::isFixedSizeAggregate(&pTVar13->targetType);
            if (bVar2) {
              pTVar13 = pool_ptr<soul::AST::TypeCast>::operator->
                                  ((pool_ptr<soul::AST::TypeCast> *)&local_f8);
              AVar17 = Type::getNumAggregateElements(&pTVar13->targetType);
              if (AVar17 == 1) {
                pTVar13 = pool_ptr<soul::AST::TypeCast>::operator*
                                    ((pool_ptr<soul::AST::TypeCast> *)&local_f8);
                pVVar7 = createAggregateWithInitialisers(this,pTVar13);
                return &pVVar7->super_Expression;
              }
            }
            pTVar13 = pool_ptr<soul::AST::TypeCast>::operator->
                                ((pool_ptr<soul::AST::TypeCast> *)&local_f8);
            pEVar11 = (pTVar13->source).object;
            pTVar13 = pool_ptr<soul::AST::TypeCast>::operator->
                                ((pool_ptr<soul::AST::TypeCast> *)&local_f8);
            SanityCheckPass::expectCastPossible
                      (&(pEVar11->super_Statement).super_ASTObject.context,&pTVar13->targetType,
                       (Type *)CONCAT44(extraout_var,iVar4));
          }
          cast<soul::AST::BinaryOperator,soul::AST::Expression>((soul *)&local_c8,e);
          if (local_c8.object == (BinaryOperator *)0x0) {
            cast<soul::AST::UnaryOperator,soul::AST::Expression>((soul *)&local_e0,e);
            if (local_e0._0_8_ == 0) {
              cast<soul::AST::ProcessorProperty,soul::AST::Expression>((soul *)&local_f8,e);
              if ((Constant *)local_f8._0_8_ != (Constant *)0x0) {
                if (this->module->moduleType != namespaceModule) {
                  pAVar1 = this->module->allocator;
                  pPVar21 = pool_ptr<soul::AST::ProcessorProperty>::operator->
                                      ((pool_ptr<soul::AST::ProcessorProperty> *)&local_f8);
                  pPVar22 = pool_ptr<soul::AST::ProcessorProperty>::operator->
                                      ((pool_ptr<soul::AST::ProcessorProperty> *)&local_f8);
                  pVVar7 = (Variable *)
                           PoolAllocator::
                           allocate<soul::heart::ProcessorProperty,soul::CodeLocation&,soul::heart::ProcessorProperty::Property&>
                                     (&pAVar1->pool,
                                      &(pPVar21->super_Expression).super_Statement.super_ASTObject.
                                       context.location,
                                      (Property *)&(pPVar22->super_Expression).field_0x2c);
                  return &pVVar7->super_Expression;
                }
                pPVar21 = pool_ptr<soul::AST::ProcessorProperty>::operator->
                                    ((pool_ptr<soul::AST::ProcessorProperty> *)&local_f8);
                Errors::processorPropertyUsedOutsideDecl<>();
                AST::Context::throwError
                          (&(pPVar21->super_Expression).super_Statement.super_ASTObject.context,
                           &local_90,false);
              }
              goto LAB_0026b351;
            }
            pUVar20 = pool_ptr<soul::AST::UnaryOperator>::operator->
                                ((pool_ptr<soul::AST::UnaryOperator> *)&local_e0);
            (*(pUVar20->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])
                      (&local_f8,pUVar20);
            pUVar20 = pool_ptr<soul::AST::UnaryOperator>::operator->
                                ((pool_ptr<soul::AST::UnaryOperator> *)&local_e0);
            pEVar10 = evaluateAsExpression(this,(pUVar20->source).object);
            pEVar10 = BlockBuilder::createCastIfNeeded
                                (&(this->builder).super_BlockBuilder,pEVar10,&local_f8);
            pUVar20 = pool_ptr<soul::AST::UnaryOperator>::operator->
                                ((pool_ptr<soul::AST::UnaryOperator> *)&local_e0);
            local_c0.sourceCode.object =
                 (pUVar20->super_Expression).super_Statement.super_ASTObject.context.location.
                 sourceCode.object;
            if (local_c0.sourceCode.object != (SourceCodeText *)0x0) {
              ((local_c0.sourceCode.object)->super_RefCountedObject).refCount =
                   ((local_c0.sourceCode.object)->super_RefCountedObject).refCount + 1;
            }
            local_c0.location.data =
                 (pUVar20->super_Expression).super_Statement.super_ASTObject.context.location.
                 location.data;
            pUVar20 = pool_ptr<soul::AST::UnaryOperator>::operator->
                                ((pool_ptr<soul::AST::UnaryOperator> *)&local_e0);
            pVVar7 = (Variable *)
                     BlockBuilder::createUnaryOp
                               (&(this->builder).super_BlockBuilder,&local_c0,pEVar10,
                                pUVar20->operation);
            this_01 = &local_c0;
          }
          else {
            pBVar18 = pool_ptr<soul::AST::BinaryOperator>::operator->(&local_c8);
            AST::BinaryOperator::getOperandType(&local_f8,pBVar18);
            pBVar18 = pool_ptr<soul::AST::BinaryOperator>::operator->(&local_c8);
            pEVar10 = evaluateAsExpression(this,(pBVar18->lhs).object);
            this_00 = &this->builder;
            pEVar10 = BlockBuilder::createCastIfNeeded
                                (&this_00->super_BlockBuilder,pEVar10,&local_f8);
            pBVar18 = pool_ptr<soul::AST::BinaryOperator>::operator->(&local_c8);
            pEVar19 = evaluateAsExpression(this,(pBVar18->rhs).object);
            pEVar19 = BlockBuilder::createCastIfNeeded
                                (&this_00->super_BlockBuilder,pEVar19,&local_f8);
            pBVar18 = pool_ptr<soul::AST::BinaryOperator>::operator->(&local_c8);
            local_b0.sourceCode.object =
                 (pBVar18->super_Expression).super_Statement.super_ASTObject.context.location.
                 sourceCode.object;
            if (local_b0.sourceCode.object != (SourceCodeText *)0x0) {
              ((local_b0.sourceCode.object)->super_RefCountedObject).refCount =
                   ((local_b0.sourceCode.object)->super_RefCountedObject).refCount + 1;
            }
            local_b0.location.data =
                 (pBVar18->super_Expression).super_Statement.super_ASTObject.context.location.
                 location.data;
            pBVar18 = pool_ptr<soul::AST::BinaryOperator>::operator->(&local_c8);
            pEVar10 = BlockBuilder::createBinaryOp
                                (&this_00->super_BlockBuilder,&local_b0,pEVar10,pEVar19,
                                 pBVar18->operation);
            pBVar18 = pool_ptr<soul::AST::BinaryOperator>::operator->(&local_c8);
            (*(pBVar18->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])
                      (&local_e0,pBVar18);
            pVVar7 = (Variable *)
                     BlockBuilder::createCastIfNeeded
                               (&this_00->super_BlockBuilder,pEVar10,&local_e0);
            RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_e0.structure);
            this_01 = &local_b0;
          }
          RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&this_01->sourceCode);
        }
        else {
          pAVar12 = pool_ptr<soul::AST::ArrayElementRef>::operator*
                              ((pool_ptr<soul::AST::ArrayElementRef> *)&local_e0);
          getArrayOrVectorType(&local_f8,this,pAVar12);
          pAVar12 = pool_ptr<soul::AST::ArrayElementRef>::operator->
                              ((pool_ptr<soul::AST::ArrayElementRef> *)&local_e0);
          pEVar11 = pool_ptr<soul::AST::Expression>::operator*(&pAVar12->object);
          pEVar10 = evaluateAsExpression(this,pEVar11,&local_f8);
          pAVar12 = pool_ptr<soul::AST::ArrayElementRef>::operator*
                              ((pool_ptr<soul::AST::ArrayElementRef> *)&local_e0);
          pVVar7 = (Variable *)createArraySubElement(this,pAVar12,pEVar10);
        }
      }
      else {
        pSVar9 = pool_ptr<soul::AST::StructMemberRef>::operator*
                           ((pool_ptr<soul::AST::StructMemberRef> *)&local_e0);
        getStructType(&local_f8,this,pSVar9);
        pSVar9 = pool_ptr<soul::AST::StructMemberRef>::operator->
                           ((pool_ptr<soul::AST::StructMemberRef> *)&local_e0);
        pEVar10 = evaluateAsExpression(this,(pSVar9->object).object,&local_f8);
        pSVar9 = pool_ptr<soul::AST::StructMemberRef>::operator*
                           ((pool_ptr<soul::AST::StructMemberRef> *)&local_e0);
        pVVar7 = (Variable *)createStructSubElement(this,pSVar9,pEVar10);
      }
    }
    else {
      pVVar8 = pool_ptr<soul::AST::VariableRef>::operator->
                         ((pool_ptr<soul::AST::VariableRef> *)&local_e0);
      bVar2 = AST::VariableDeclaration::isAssignable((pVVar8->variable).object);
      if (bVar2) {
        pool_ptr<soul::AST::VariableRef>::operator->((pool_ptr<soul::AST::VariableRef> *)&local_e0);
        AST::Scope::findModule((Scope *)&local_f8);
        AST::Scope::findModule(&local_a0);
        if ((_func_int **)local_f8._0_8_ != local_a0._vptr_Scope) {
          pVVar8 = pool_ptr<soul::AST::VariableRef>::operator->
                             ((pool_ptr<soul::AST::VariableRef> *)&local_e0);
          Errors::cannotReferenceOtherProcessorVar<>();
          AST::Context::throwError
                    (&(pVVar8->super_Expression).super_Statement.super_ASTObject.context,&local_58,
                     false);
        }
      }
      pVVar8 = pool_ptr<soul::AST::VariableRef>::operator->
                         ((pool_ptr<soul::AST::VariableRef> *)&local_e0);
      local_f8._0_8_ = (((pVVar8->variable).object)->generatedVariable).object;
      if ((Variable *)local_f8._0_8_ != (Variable *)0x0) {
        pVVar7 = pool_ptr<soul::heart::Variable>::operator*
                           ((pool_ptr<soul::heart::Variable> *)&local_f8);
        return &pVVar7->super_Expression;
      }
      pVVar8 = pool_ptr<soul::AST::VariableRef>::operator->
                         ((pool_ptr<soul::AST::VariableRef> *)&local_e0);
      local_f8._0_8_ = (((pVVar8->variable).object)->initialValue).object;
      if ((Constant *)local_f8._0_8_ != (Constant *)0x0) {
        pEVar11 = pool_ptr<soul::AST::Expression>::operator*
                            ((pool_ptr<soul::AST::Expression> *)&local_f8);
        pVVar7 = (Variable *)evaluateAsExpression(this,pEVar11);
        return &pVVar7->super_Expression;
      }
      pVVar8 = pool_ptr<soul::AST::VariableRef>::operator->
                         ((pool_ptr<soul::AST::VariableRef> *)&local_e0);
      (*(pVVar8->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])
                (&local_f8,pVVar8);
      pVVar7 = (Variable *)
               BlockBuilder::createZeroInitialiser(&(this->builder).super_BlockBuilder,&local_f8);
    }
    RefCountedPtr<soul::Structure>::~RefCountedPtr
              ((RefCountedPtr<soul::Structure> *)((long)&local_f8 + 0x10));
  }
  else {
LAB_0026b351:
    pVVar7 = (Variable *)getExpressionAsConstLocalCopy(this,e);
  }
  return &pVVar7->super_Expression;
}

Assistant:

heart::Expression& evaluateAsExpression (AST::Expression& e)
    {
        if (++expressionDepth < maxExpressionDepth)
        {
            if (auto c = e.getAsConstant())
                return module.allocator.allocate<heart::Constant> (c->context.location, c->value);

            if (auto v = cast<AST::VariableRef> (e))
            {
                if (v->variable->isAssignable())
                    if (v->variable->getParentScope()->findModule() != e.getParentScope()->findModule())
                        v->context.throwError (Errors::cannotReferenceOtherProcessorVar());

                if (auto a = v->variable->generatedVariable)
                    return *a;

                if (auto initial = v->variable->initialValue)
                    return evaluateAsExpression (*initial);

                return builder.createZeroInitialiser (v->getResultType());
            }

            if (auto member = cast<AST::StructMemberRef> (e))
            {
                auto structType = getStructType (*member);

                auto& source = evaluateAsExpression (member->object, structType);
                return createStructSubElement (*member, source);
            }

            if (auto subscript = cast<AST::ArrayElementRef> (e))
            {
                auto arrayOrVectorType = getArrayOrVectorType (*subscript);
                auto& source = evaluateAsExpression (*subscript->object, arrayOrVectorType);
                return createArraySubElement (*subscript, source);
            }

            if (auto c = cast<AST::TypeCast> (e))
            {
                SOUL_ASSERT (c->getNumArguments() != 0);

                pool_ref<AST::Expression> source = c->source;

                if (auto list = cast<AST::CommaSeparatedList> (c->source))
                {
                    if (list->items.size() != 1)
                        return createAggregateWithInitialisers (*c);

                    source = list->items.front();
                }

                auto& sourceExp = evaluateAsExpression (source);
                const auto& sourceType = sourceExp.getType();

                if (TypeRules::canCastTo (c->targetType, sourceType))
                    return builder.createCastIfNeeded (sourceExp, c->targetType);

                if (c->targetType.isFixedSizeAggregate() && c->targetType.getNumAggregateElements() == 1)
                    return createAggregateWithInitialisers (*c);

                SanityCheckPass::expectCastPossible (c->source->context, c->targetType, sourceType);
            }

            if (auto op = cast<AST::BinaryOperator> (e))
            {
                auto operandType = op->getOperandType();

                // (putting these into locals to make sure we evaluate everything in left-to-right order)
                auto& lhs = builder.createCastIfNeeded (evaluateAsExpression (op->lhs), operandType);
                auto& rhs = builder.createCastIfNeeded (evaluateAsExpression (op->rhs), operandType);

                return builder.createCastIfNeeded (builder.createBinaryOp (op->context.location, lhs, rhs, op->operation),
                                                   op->getResultType());
            }

            if (auto op = cast<AST::UnaryOperator> (e))
            {
                auto sourceType = op->getResultType();
                auto& source = builder.createCastIfNeeded (evaluateAsExpression (op->source), sourceType);
                return builder.createUnaryOp (op->context.location, source, op->operation);
            }

            if (auto pp = cast<AST::ProcessorProperty> (e))
            {
                if (module.isNamespace())
                    pp->context.throwError (Errors::processorPropertyUsedOutsideDecl());

                return module.allocator.allocate<heart::ProcessorProperty> (pp->context.location, pp->property);
            }
        }

        return getExpressionAsConstLocalCopy (e);
    }